

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tfidfinit.cpp
# Opt level: O2

void printshape(char *out_file)

{
  pointer ppVar1;
  FILE *__stream;
  ulong uVar2;
  int j;
  ulong uVar3;
  int k;
  ulong uVar4;
  long lVar5;
  paaword now;
  
  __stream = fopen(out_file,"w");
  for (lVar5 = 0; lVar5 < num_c; lVar5 = lVar5 + 1) {
    fprintf(__stream,"%d\n",(ulong)(uint)shapelets_n[lVar5]);
    for (uVar3 = 0;
        ppVar1 = results[lVar5].super__Vector_base<paaword,_std::allocator<paaword>_>._M_impl.
                 super__Vector_impl_data._M_start,
        uVar3 < (ulong)(((long)results[lVar5].super__Vector_base<paaword,_std::allocator<paaword>_>.
                               _M_impl.super__Vector_impl_data._M_finish - (long)ppVar1) / 0x88);
        uVar3 = uVar3 + 1) {
      paaword::paaword(&now,ppVar1 + uVar3);
      fprintf(__stream,"%f,%d",-now.score,
              ((long)now.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)now.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start >> 2) * (long)now.window);
      uVar4 = 0;
      while( true ) {
        uVar2 = ((long)now.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)now.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start >> 2) * (long)now.window;
        if (uVar2 < uVar4 || uVar2 - uVar4 == 0) break;
        uVar2 = (ulong)(uint)((int)uVar4 >> 0x1f) << 0x20 | uVar4 & 0xffffffff;
        fprintf(__stream,",%f",
                ((double)now.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[(int)((long)uVar2 / (long)now.window)] +
                0.5) * bucket_w + min_data,(long)uVar2 % (long)now.window & 0xffffffff);
        uVar4 = uVar4 + 1;
      }
      fputc(10,__stream);
      paaword::~paaword(&now);
    }
  }
  fclose(__stream);
  return;
}

Assistant:

void printshape(char *out_file) {
    FILE *f;
    f = fopen(out_file, "w");

    for (int i = 0; i < num_c; ++i) {
        fprintf(f, "%d\n", shapelets_n[i]);
//        for (paaword now : results[i]) {
        for (int j = 0; j < results[i].size(); ++j) {
            paaword now = results[i][j];
            fprintf(f, "%f,%d", -now.score, now.window * now.vec.size());
            for (int k = 0; k < now.window * now.vec.size(); ++k) {
                fprintf(f, ",%f", paa2ts(now.vec[k / now.window]));
            }
            fprintf(f, "\n");
//            fprintf(f, "vector\t\t");
//            for (int k = 0; k < now.vec.size(); ++k) {
//                fprintf(f, " %d", now.vec[k]);
//            }
//            fprintf(f, "\ncover\t\t");
//            for (set<int>::iterator cov = now.cov.begin(); cov != now.cov.end(); ++cov) {
//                fprintf(f, " %d", *cov);
//            }
//            fprintf(f, "\nall cover\t");
//            for (set<int>::iterator cov = now.allcov.begin(); cov != now.allcov.end(); ++cov) {
//                fprintf(f, " %d", *cov);
//            }
//            fprintf(f, "\n");
        }
    }

    fclose(f);
}